

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Padding_x86::forward(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 *puVar1;
  float *pfVar2;
  uint _c;
  uint uVar3;
  int *piVar4;
  void *pvVar5;
  Allocator *pAVar6;
  size_t sVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined8 uVar19;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  undefined4 *puVar30;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  float *pfVar36;
  int iVar37;
  ulong uVar38;
  long lVar39;
  int iVar40;
  int x_2;
  int iVar41;
  long lVar42;
  undefined4 *puVar43;
  int x;
  undefined4 *puVar44;
  int z;
  float *pfVar45;
  long lVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  bool bVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar55 [16];
  __m128 pad_value;
  Mat m_1;
  __m128 pad_value_1;
  undefined4 uVar13;
  undefined3 uVar15;
  undefined2 uVar17;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined3 uVar22;
  undefined1 uVar23;
  undefined2 uVar24;
  undefined1 uVar25;
  
  uVar32 = (this->super_Padding).top;
  iVar26 = (this->super_Padding).bottom;
  uVar49._0_4_ = (this->super_Padding).left;
  uVar49._4_4_ = (this->super_Padding).right;
  uVar47._0_4_ = (this->super_Padding).front;
  uVar47._4_4_ = (this->super_Padding).behind;
  auVar55._0_4_ = -(uint)((undefined4)uVar49 == 0);
  auVar55._4_4_ = -(uint)(uVar49._4_4_ == 0);
  auVar55._8_4_ = -(uint)((undefined4)uVar47 == 0);
  auVar55._12_4_ = -(uint)(uVar47._4_4_ == 0);
  iVar31 = movmskps((int)top_blob,auVar55);
  if ((iVar26 == 0 && uVar32 == 0) && iVar31 == 0xf) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar4 = bottom_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = top_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          free(top_blob->data);
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar4 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar4;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar26 = bottom_blob->w;
    iVar31 = bottom_blob->h;
    iVar37 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar26;
    top_blob->h = iVar31;
    top_blob->d = iVar37;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar31 = bottom_blob->elempack;
  uVar27 = bottom_blob->elemsize;
  if ((iVar31 != 0) && (((int)uVar27 * 8) / iVar31 == 8)) {
    iVar26 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar26;
  }
  iVar37 = bottom_blob->w;
  iVar29 = bottom_blob->h;
  iVar40 = bottom_blob->d;
  _c = bottom_blob->c;
  uVar33 = (ulong)_c;
  if (iVar31 == 4) {
    switch(bottom_blob->dims) {
    case 1:
      if ((((uVar49 & 3) == 0) && ((uVar49._4_4_ + (undefined4)uVar49 & 3) == 0)) &&
         ((this->super_Padding).type == 0)) {
        Mat::create(top_blob,uVar49._4_4_ + (undefined4)uVar49 + iVar37 * 4 >> 2,
                    uVar27 & 0xfffffffffffffffc,4,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        pad_value[1] = (this->super_Padding).value;
        pad_value[0] = pad_value[1];
        pad_value[3] = pad_value[1];
        pad_value[2] = pad_value[1];
        padding_constant_pack4_sse
                  (bottom_blob,top_blob,0,0,(this->super_Padding).left / 4,
                   (this->super_Padding).right / 4,&pad_value);
        return 0;
      }
      break;
    case 2:
      if ((((uVar32 & 3) == 0) && (uVar32 = uVar32 + iVar29 * 4 + iVar26, (uVar32 & 3) == 0)) &&
         ((this->super_Padding).type == 0)) {
        Mat::create(top_blob,uVar49._4_4_ + (undefined4)uVar49 + iVar37,(int)uVar32 >> 2,
                    uVar27 & 0xfffffffffffffffc,4,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        pad_value[1] = (this->super_Padding).value;
        pad_value[0] = pad_value[1];
        pad_value[3] = pad_value[1];
        pad_value[2] = pad_value[1];
        padding_constant_pack4_sse
                  (bottom_blob,top_blob,(this->super_Padding).top / 4,
                   (this->super_Padding).bottom / 4,(this->super_Padding).left,
                   (this->super_Padding).right,&pad_value);
        return 0;
      }
      break;
    case 3:
      uVar35 = uVar47._4_4_ + (undefined4)uVar47 + _c * 4;
      bVar50 = (uVar35 & 3) == 0;
      if (((uVar47 & 3) == 0 && bVar50) && ((uVar35 == _c * 4 || ((this->super_Padding).type == 0)))
         ) {
        uVar35 = (int)uVar35 >> 2;
        Mat::create(top_blob,uVar49._4_4_ + (undefined4)uVar49 + iVar37,uVar32 + iVar29 + iVar26,
                    uVar35,(uVar27 >> 2) << bVar50 * '\x02',4,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        uVar49 = (long)(this->super_Padding).front / -4;
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        uVar27 = uVar49 & 0xffffffff;
        for (uVar47 = 0; uVar47 != uVar35; uVar47 = uVar47 + 1) {
          uVar33 = top_blob->elemsize;
          pfVar45 = (float *)(top_blob->cstep * uVar47 * uVar33 + (long)top_blob->data);
          pAVar6 = top_blob->allocator;
          pad_value[2] = 0.0;
          pad_value[3] = 0.0;
          uVar28 = (long)top_blob->h * (long)top_blob->w;
          uVar33 = (uVar33 * uVar28 + 0xf & 0xfffffffffffffff0) / uVar33;
          if (top_blob->dims == 4) {
            uVar33 = uVar28;
          }
          if ((this->super_Padding).per_channel_pad_data_size == 0) {
            pad_value_1[0] = (this->super_Padding).value;
            pad_value_1[1] = pad_value_1[0];
            pad_value_1[2] = pad_value_1[0];
            pad_value_1[3] = pad_value_1[0];
          }
          else {
            pfVar36 = (float *)((long)(this->super_Padding).per_channel_pad_data.data +
                               uVar47 * 0x10);
            pad_value_1[0] = *pfVar36;
            pad_value_1[1] = pfVar36[1];
            pad_value_1[2] = pfVar36[2];
            pad_value_1[3] = pfVar36[3];
          }
          uVar32 = (int)uVar49 + (int)uVar47;
          if ((int)uVar32 < 0 || (int)_c <= (int)uVar32) {
            iVar26 = top_blob->d * (int)uVar33;
            if (iVar26 < 1) {
              iVar26 = 0;
            }
            while (bVar50 = iVar26 != 0, iVar26 = iVar26 + -1, bVar50) {
              *pfVar45 = pad_value_1[0];
              pfVar45[1] = pad_value_1[1];
              pfVar45[2] = pad_value_1[2];
              pfVar45[3] = pad_value_1[3];
              pfVar45 = pfVar45 + 4;
            }
          }
          else {
            m_1.w = bottom_blob->w;
            m_1.h = bottom_blob->h;
            m_1.c = bottom_blob->d;
            pvVar5 = bottom_blob->data;
            uVar33 = bottom_blob->elemsize;
            sVar7 = bottom_blob->cstep;
            pfVar36 = (float *)(uVar32 * sVar7 * uVar33 + (long)pvVar5);
            m_1.allocator = bottom_blob->allocator;
            m_1.refcount = (int *)0x0;
            m_1.elempack = bottom_blob->elempack;
            m_1.d = 1;
            m_1.dims = bottom_blob->dims + -1;
            m_1.cstep = (uVar33 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar33;
            if (bottom_blob->dims == 4) {
              m_1.cstep = (long)m_1.h * (long)m_1.w;
            }
            iVar26 = (this->super_Padding).type;
            pad_value._0_8_ = pfVar45;
            m_1.data = pfVar36;
            m_1.elemsize = uVar33;
            if (iVar26 == 0) {
              padding_constant_pack4_sse
                        (&m_1,(Mat *)pad_value,(this->super_Padding).top,
                         (this->super_Padding).bottom,(this->super_Padding).left,
                         (this->super_Padding).right,&pad_value_1);
              iVar26 = (this->super_Padding).type;
            }
            if (iVar26 == 1) {
              iVar26 = (this->super_Padding).left;
              iVar37 = 0;
              iVar31 = 0;
              if (iVar26 < 1) {
                iVar26 = iVar31;
              }
              iVar29 = (this->super_Padding).right;
              if (iVar29 < 1) {
                iVar29 = iVar31;
              }
              iVar40 = (this->super_Padding).top;
              if (iVar40 < 1) {
                iVar40 = iVar31;
              }
              iVar31 = (this->super_Padding).bottom;
              for (; iVar37 != iVar40; iVar37 = iVar37 + 1) {
                fVar51 = *pfVar36;
                fVar52 = pfVar36[1];
                fVar53 = pfVar36[2];
                fVar54 = pfVar36[3];
                iVar41 = iVar26;
                while (bVar50 = iVar41 != 0, iVar41 = iVar41 + -1, bVar50) {
                  *pfVar45 = fVar51;
                  pfVar45[1] = fVar52;
                  pfVar45[2] = fVar53;
                  pfVar45[3] = fVar54;
                  pfVar45 = pfVar45 + 4;
                }
                lVar42 = 0;
                for (iVar41 = 0; iVar41 < m_1.w; iVar41 = iVar41 + 1) {
                  pfVar2 = (float *)((long)pvVar5 + lVar42 + sVar7 * uVar33 * uVar27);
                  fVar51 = *pfVar2;
                  fVar52 = pfVar2[1];
                  fVar53 = pfVar2[2];
                  fVar54 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar45 + lVar42);
                  *pfVar2 = fVar51;
                  pfVar2[1] = fVar52;
                  pfVar2[2] = fVar53;
                  pfVar2[3] = fVar54;
                  lVar42 = lVar42 + 0x10;
                }
                pfVar45 = (float *)((long)pfVar45 + lVar42);
                iVar41 = iVar29;
                while (bVar50 = iVar41 != 0, iVar41 = iVar41 + -1, bVar50) {
                  *pfVar45 = fVar51;
                  pfVar45[1] = fVar52;
                  pfVar45[2] = fVar53;
                  pfVar45[3] = fVar54;
                  pfVar45 = pfVar45 + 4;
                }
              }
              for (iVar37 = 0; iVar37 < m_1.h; iVar37 = iVar37 + 1) {
                fVar51 = *pfVar36;
                fVar52 = pfVar36[1];
                fVar53 = pfVar36[2];
                fVar54 = pfVar36[3];
                iVar40 = iVar26;
                while (bVar50 = iVar40 != 0, iVar40 = iVar40 + -1, bVar50) {
                  *pfVar45 = fVar51;
                  pfVar45[1] = fVar52;
                  pfVar45[2] = fVar53;
                  pfVar45[3] = fVar54;
                  pfVar45 = pfVar45 + 4;
                }
                for (iVar40 = 0; iVar41 = iVar29, iVar40 < m_1.w; iVar40 = iVar40 + 1) {
                  fVar51 = *pfVar36;
                  fVar52 = pfVar36[1];
                  fVar53 = pfVar36[2];
                  fVar54 = pfVar36[3];
                  *pfVar45 = fVar51;
                  pfVar45[1] = fVar52;
                  pfVar45[2] = fVar53;
                  pfVar45[3] = fVar54;
                  pfVar36 = pfVar36 + 4;
                  pfVar45 = pfVar45 + 4;
                }
                while (iVar41 != 0) {
                  *pfVar45 = fVar51;
                  pfVar45[1] = fVar52;
                  pfVar45[2] = fVar53;
                  pfVar45[3] = fVar54;
                  pfVar45 = pfVar45 + 4;
                  iVar41 = iVar41 + -1;
                }
              }
              pfVar36 = pfVar36 + -(long)(m_1.w << 2);
              iVar37 = 0;
              if (iVar31 < 1) {
                iVar31 = iVar37;
              }
              for (; iVar37 != iVar31; iVar37 = iVar37 + 1) {
                fVar51 = *pfVar36;
                fVar52 = pfVar36[1];
                fVar53 = pfVar36[2];
                fVar54 = pfVar36[3];
                iVar40 = iVar26;
                while (bVar50 = iVar40 != 0, iVar40 = iVar40 + -1, bVar50) {
                  *pfVar45 = fVar51;
                  pfVar45[1] = fVar52;
                  pfVar45[2] = fVar53;
                  pfVar45[3] = fVar54;
                  pfVar45 = pfVar45 + 4;
                }
                lVar42 = 0;
                for (iVar40 = 0; iVar40 < m_1.w; iVar40 = iVar40 + 1) {
                  pfVar2 = (float *)((long)pfVar36 + lVar42);
                  fVar51 = *pfVar2;
                  fVar52 = pfVar2[1];
                  fVar53 = pfVar2[2];
                  fVar54 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar45 + lVar42);
                  *pfVar2 = fVar51;
                  pfVar2[1] = fVar52;
                  pfVar2[2] = fVar53;
                  pfVar2[3] = fVar54;
                  lVar42 = lVar42 + 0x10;
                }
                pfVar45 = (float *)((long)pfVar45 + lVar42);
                iVar40 = iVar29;
                while (bVar50 = iVar40 != 0, iVar40 = iVar40 + -1, bVar50) {
                  *pfVar45 = fVar51;
                  pfVar45[1] = fVar52;
                  pfVar45[2] = fVar53;
                  pfVar45[3] = fVar54;
                  pfVar45 = pfVar45 + 4;
                }
              }
              iVar26 = (this->super_Padding).type;
            }
            if (iVar26 == 2) {
              iVar26 = (this->super_Padding).top;
              uVar32 = (this->super_Padding).left;
              puVar30 = (undefined4 *)((long)(m_1.w * iVar26 * 4) * 4 + (long)m_1.data);
              uVar28 = 0;
              uVar33 = 0;
              if (0 < (int)uVar32) {
                uVar33 = (ulong)uVar32;
              }
              uVar3 = (this->super_Padding).right;
              uVar38 = (ulong)uVar3;
              if ((int)uVar3 < 1) {
                uVar38 = uVar28;
              }
              iVar31 = (this->super_Padding).bottom;
              if (iVar26 < 1) {
                iVar26 = 0;
              }
              lVar42 = (long)(int)uVar32 * 0x10;
              lVar34 = uVar33 * 0x10;
              lVar39 = uVar38 * 0x10;
              puVar43 = (undefined4 *)pad_value._0_8_;
              while( true ) {
                if ((int)uVar28 == iVar26) break;
                lVar46 = 0;
                for (lVar48 = 0; lVar34 + lVar48 != 0; lVar48 = lVar48 + -0x10) {
                  puVar44 = (undefined4 *)((long)puVar30 + lVar48 + lVar42);
                  uVar8 = puVar44[1];
                  uVar9 = puVar44[2];
                  uVar10 = puVar44[3];
                  puVar1 = (undefined4 *)((long)puVar43 + lVar46);
                  *puVar1 = *puVar44;
                  puVar1[1] = uVar8;
                  puVar1[2] = uVar9;
                  puVar1[3] = uVar10;
                  lVar46 = lVar46 + 0x10;
                }
                puVar43 = (undefined4 *)((long)puVar43 - lVar48);
                lVar46 = -0x20;
                puVar44 = puVar30;
                for (iVar37 = 0; iVar37 < m_1.w; iVar37 = iVar37 + 1) {
                  uVar8 = puVar44[1];
                  uVar9 = puVar44[2];
                  uVar10 = puVar44[3];
                  *puVar43 = *puVar44;
                  puVar43[1] = uVar8;
                  puVar43[2] = uVar9;
                  puVar43[3] = uVar10;
                  puVar44 = puVar44 + 4;
                  puVar43 = puVar43 + 4;
                }
                for (; lVar39 + lVar46 != -0x20; lVar46 = lVar46 + -0x10) {
                  puVar1 = (undefined4 *)((long)puVar44 + lVar46);
                  uVar8 = puVar1[1];
                  uVar9 = puVar1[2];
                  uVar10 = puVar1[3];
                  *puVar43 = *puVar1;
                  puVar43[1] = uVar8;
                  puVar43[2] = uVar9;
                  puVar43[3] = uVar10;
                  puVar43 = puVar43 + 4;
                }
                puVar30 = puVar30 + (long)m_1.w * -4;
                uVar28 = (ulong)((int)uVar28 + 1);
              }
              for (iVar26 = 0; iVar26 < m_1.h; iVar26 = iVar26 + 1) {
                lVar48 = 0;
                for (lVar46 = 0; lVar34 + lVar46 != 0; lVar46 = lVar46 + -0x10) {
                  puVar44 = (undefined4 *)((long)puVar30 + lVar46 + lVar42);
                  uVar8 = puVar44[1];
                  uVar9 = puVar44[2];
                  uVar10 = puVar44[3];
                  puVar1 = (undefined4 *)((long)puVar43 + lVar48);
                  *puVar1 = *puVar44;
                  puVar1[1] = uVar8;
                  puVar1[2] = uVar9;
                  puVar1[3] = uVar10;
                  lVar48 = lVar48 + 0x10;
                }
                puVar43 = (undefined4 *)((long)puVar43 - lVar46);
                for (iVar37 = 0; lVar46 = -0x20, iVar37 < m_1.w; iVar37 = iVar37 + 1) {
                  uVar8 = puVar30[1];
                  uVar9 = puVar30[2];
                  uVar10 = puVar30[3];
                  *puVar43 = *puVar30;
                  puVar43[1] = uVar8;
                  puVar43[2] = uVar9;
                  puVar43[3] = uVar10;
                  puVar30 = puVar30 + 4;
                  puVar43 = puVar43 + 4;
                }
                for (; lVar39 + lVar46 != -0x20; lVar46 = lVar46 + -0x10) {
                  puVar44 = (undefined4 *)((long)puVar30 + lVar46);
                  uVar8 = puVar44[1];
                  uVar9 = puVar44[2];
                  uVar10 = puVar44[3];
                  *puVar43 = *puVar44;
                  puVar43[1] = uVar8;
                  puVar43[2] = uVar9;
                  puVar43[3] = uVar10;
                  puVar43 = puVar43 + 4;
                }
              }
              puVar30 = puVar30 + (long)m_1.w * -8;
              iVar26 = 0;
              if (iVar31 < 1) {
                iVar31 = iVar26;
              }
              for (; iVar26 != iVar31; iVar26 = iVar26 + 1) {
                lVar48 = 0;
                for (lVar46 = 0; lVar34 + lVar46 != 0; lVar46 = lVar46 + -0x10) {
                  puVar44 = (undefined4 *)((long)puVar30 + lVar46 + lVar42);
                  uVar8 = puVar44[1];
                  uVar9 = puVar44[2];
                  uVar10 = puVar44[3];
                  puVar1 = (undefined4 *)((long)puVar43 + lVar48);
                  *puVar1 = *puVar44;
                  puVar1[1] = uVar8;
                  puVar1[2] = uVar9;
                  puVar1[3] = uVar10;
                  lVar48 = lVar48 + 0x10;
                }
                puVar43 = (undefined4 *)((long)puVar43 - lVar46);
                puVar44 = puVar30;
                for (iVar37 = 0; lVar46 = -0x20, iVar37 < m_1.w; iVar37 = iVar37 + 1) {
                  uVar8 = puVar44[1];
                  uVar9 = puVar44[2];
                  uVar10 = puVar44[3];
                  *puVar43 = *puVar44;
                  puVar43[1] = uVar8;
                  puVar43[2] = uVar9;
                  puVar43[3] = uVar10;
                  puVar44 = puVar44 + 4;
                  puVar43 = puVar43 + 4;
                }
                for (; lVar39 + lVar46 != -0x20; lVar46 = lVar46 + -0x10) {
                  puVar1 = (undefined4 *)((long)puVar44 + lVar46);
                  uVar8 = puVar1[1];
                  uVar9 = puVar1[2];
                  uVar10 = puVar1[3];
                  *puVar43 = *puVar1;
                  puVar43[1] = uVar8;
                  puVar43[2] = uVar9;
                  puVar43[3] = uVar10;
                  puVar43 = puVar43 + 4;
                }
                puVar30 = puVar30 + (long)m_1.w * -4;
              }
            }
            if (m_1.refcount != (int *)0x0) {
              LOCK();
              *m_1.refcount = *m_1.refcount + -1;
              UNLOCK();
              if (*m_1.refcount == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  free(m_1.data);
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            if (pad_value._8_8_ != 0) {
              LOCK();
              *(int *)pad_value._8_8_ = *(int *)pad_value._8_8_ + -1;
              UNLOCK();
              if (*(int *)pad_value._8_8_ == 0) {
                if (pAVar6 == (Allocator *)0x0) {
                  free((void *)pad_value._0_8_);
                }
                else {
                  (*pAVar6->_vptr_Allocator[3])();
                }
              }
            }
          }
          uVar27 = (ulong)((int)uVar27 + 1);
        }
        return 0;
      }
      break;
    case 4:
      if ((this->super_Padding).type == 0) {
        uVar35 = uVar47._4_4_ + (undefined4)uVar47 + iVar40;
        Mat::create(top_blob,uVar49._4_4_ + (undefined4)uVar49 + iVar37,uVar32 + iVar29 + iVar26,
                    uVar35,_c,uVar27,4,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)_c < 1) {
          uVar33 = 0;
        }
        for (uVar49 = 0; uVar49 != uVar33; uVar49 = uVar49 + 1) {
          if ((this->super_Padding).per_channel_pad_data_size == 0) {
            fVar51 = (this->super_Padding).value;
            fVar52 = fVar51;
            fVar53 = fVar51;
            fVar54 = fVar51;
          }
          else {
            pfVar45 = (float *)((long)(this->super_Padding).per_channel_pad_data.data +
                               uVar49 * 0x10);
            fVar51 = *pfVar45;
            fVar52 = pfVar45[1];
            fVar53 = pfVar45[2];
            fVar54 = pfVar45[3];
          }
          pad_value_1[0] = fVar51;
          pad_value_1[1] = fVar52;
          pad_value_1[2] = fVar53;
          pad_value_1[3] = fVar54;
          for (uVar47 = 0; uVar47 != uVar35; uVar47 = uVar47 + 1) {
            uVar27 = (long)top_blob->h * (long)top_blob->w;
            pad_value._0_8_ =
                 (long)top_blob->data +
                 uVar47 * top_blob->elemsize * uVar27 +
                 top_blob->cstep * uVar49 * top_blob->elemsize;
            pad_value[2] = 0.0;
            pad_value[3] = 0.0;
            uVar32 = (int)uVar47 - (this->super_Padding).front;
            if ((int)uVar32 < 0 || iVar40 <= (int)uVar32) {
              uVar28 = uVar27 & 0xffffffff;
              if ((int)uVar27 < 1) {
                uVar28 = 0;
              }
              while (iVar26 = (int)uVar28, uVar28 = (ulong)(iVar26 - 1), iVar26 != 0) {
                *(float *)pad_value._0_8_ = fVar51;
                *(float *)(pad_value._0_8_ + 4) = fVar52;
                *(float *)(pad_value._0_8_ + 8) = fVar53;
                *(float *)(pad_value._0_8_ + 0xc) = fVar54;
                pad_value._0_8_ = pad_value._0_8_ + 0x10;
              }
            }
            else {
              m_1.h = bottom_blob->h;
              m_1.elemsize = bottom_blob->elemsize;
              m_1.allocator = bottom_blob->allocator;
              m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
              m_1.data = (void *)((long)bottom_blob->data +
                                 uVar32 * m_1.elemsize * m_1.cstep +
                                 bottom_blob->cstep * uVar49 * m_1.elemsize);
              m_1.refcount = (int *)0x0;
              m_1.elempack = bottom_blob->elempack;
              m_1.w = bottom_blob->w;
              m_1.dims = 2;
              m_1.d = 1;
              m_1.c = 1;
              padding_constant_pack4_sse
                        (&m_1,(Mat *)pad_value,(this->super_Padding).top,
                         (this->super_Padding).bottom,(this->super_Padding).left,
                         (this->super_Padding).right,&pad_value_1);
            }
          }
        }
        return 0;
      }
    }
  }
  pad_value._0_8_ = bottom_blob->data;
  pad_value._8_8_ = bottom_blob->refcount;
  pAVar6 = bottom_blob->allocator;
  sVar7 = bottom_blob->cstep;
  if ((int *)pad_value._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)pad_value._8_8_ = *(int *)pad_value._8_8_ + 1;
    UNLOCK();
  }
  if (iVar31 != 1) {
    m_1.data = *(void **)opt;
    m_1.elemsize = (size_t)opt->workspace_allocator;
    m_1.elempack = opt->openmp_blocktime;
    m_1._28_1_ = opt->use_winograd_convolution;
    m_1._29_1_ = opt->use_sgemm_convolution;
    m_1._30_1_ = opt->use_int8_inference;
    m_1._31_1_ = opt->use_vulkan_compute;
    m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
    m_1._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
    uVar11 = opt->flush_denormals;
    uVar12 = opt->use_local_pool_allocator;
    uVar14 = opt->use_shader_local_memory;
    uVar16 = opt->use_cooperative_matrix;
    uVar18 = opt->use_winograd23_convolution;
    uVar17 = CONCAT11(uVar18,uVar16);
    uVar15 = CONCAT21(uVar17,uVar14);
    uVar13 = CONCAT31(uVar15,uVar12);
    uVar19._0_1_ = opt->use_winograd43_convolution;
    uVar19._1_1_ = opt->use_winograd63_convolution;
    uVar19._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar19._3_1_ = opt->use_fp16_uniform;
    uVar20 = opt->use_int8_uniform;
    uVar21 = opt->use_reserved_9;
    uVar23 = opt->use_reserved_10;
    uVar25 = opt->use_reserved_11;
    uVar24 = CONCAT11(uVar25,uVar23);
    uVar22 = CONCAT21(uVar24,uVar21);
    uVar19._4_4_ = CONCAT31(uVar22,uVar20);
    m_1.c = (int)uVar19;
    m_1.refcount = (int *)opt->workspace_allocator;
    m_1.h = uVar11;
    m_1.d = uVar13;
    m_1._60_4_ = uVar19._4_4_;
    convert_packing(bottom_blob,(Mat *)pad_value,1,(Option *)&m_1);
    if ((pad_value._0_8_ == 0) || ((long)(int)_c * sVar7 == 0)) {
      iVar26 = -100;
      goto LAB_003bda6e;
    }
  }
  iVar26 = Padding::forward(&this->super_Padding,(Mat *)pad_value,top_blob,opt);
LAB_003bda6e:
  if (pad_value._8_8_ != 0) {
    LOCK();
    *(int *)pad_value._8_8_ = *(int *)pad_value._8_8_ + -1;
    UNLOCK();
    if (*(int *)pad_value._8_8_ == 0) {
      if (pAVar6 == (Allocator *)0x0) {
        free((void *)pad_value._0_8_);
      }
      else {
        (*pAVar6->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int Padding_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}